

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::detail::GenericFeaturesPNextNode::combine
          (GenericFeaturesPNextNode *this,GenericFeaturesPNextNode *right)

{
  bool local_29;
  uint local_1c;
  uint32_t i;
  GenericFeaturesPNextNode *right_local;
  GenericFeaturesPNextNode *this_local;
  
  if (this->sType != right->sType) {
    __assert_fail("sType == right.sType && \"Non-matching sTypes in features nodes!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                  ,0x39,
                  "void vkb::detail::GenericFeaturesPNextNode::combine(const GenericFeaturesPNextNode &)"
                 );
  }
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    local_29 = true;
    if (this->fields[local_1c] == 0) {
      local_29 = right->fields[local_1c] != 0;
    }
    this->fields[local_1c] = (uint)local_29;
  }
  return;
}

Assistant:

void GenericFeaturesPNextNode::combine(GenericFeaturesPNextNode const& right) noexcept {
    assert(sType == right.sType && "Non-matching sTypes in features nodes!");
    for (uint32_t i = 0; i < GenericFeaturesPNextNode::field_capacity; i++) {
        fields[i] = fields[i] || right.fields[i];
    }
}